

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_uniform(aom_writer *w,int n,int v)

{
  int data;
  int bits;
  int in_EDX;
  int in_ESI;
  int m;
  int l;
  
  data = get_unsigned_bits(0);
  bits = (1 << ((byte)data & 0x1f)) - in_ESI;
  if (data != 0) {
    if (in_EDX < bits) {
      aom_write_literal((aom_writer *)CONCAT44(in_ESI,in_EDX),data,bits);
    }
    else {
      aom_write_literal((aom_writer *)CONCAT44(in_ESI,in_EDX),data,bits);
      aom_write_literal((aom_writer *)CONCAT44(in_ESI,in_EDX),data,bits);
    }
  }
  return;
}

Assistant:

static inline void write_uniform(aom_writer *w, int n, int v) {
  const int l = get_unsigned_bits(n);
  const int m = (1 << l) - n;
  if (l == 0) return;
  if (v < m) {
    aom_write_literal(w, v, l - 1);
  } else {
    aom_write_literal(w, m + ((v - m) >> 1), l - 1);
    aom_write_literal(w, (v - m) & 1, 1);
  }
}